

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_257,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RTCRayQueryFlags RVar1;
  BVH *bvh;
  size_t sVar2;
  RTCIntersectArguments *pRVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  char cVar21;
  bool bVar22;
  int iVar23;
  undefined4 uVar24;
  RTCIntersectArguments *pRVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  ulong *puVar29;
  long lVar30;
  RTCIntersectArguments *pRVar31;
  ulong uVar32;
  NodeRef root;
  undefined1 (*pauVar33) [32];
  float fVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 in_ZMM1 [64];
  float fVar46;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar65 [16];
  undefined1 auVar68 [32];
  undefined1 auVar66 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  vfloat4 a0;
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [32];
  vbool<8> terminated;
  vbool<8> valid_o;
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_29c0;
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [8];
  float fStack_2918;
  float fStack_2914;
  float fStack_2910;
  float fStack_290c;
  float fStack_2908;
  undefined1 local_2900 [8];
  float fStack_28f8;
  float fStack_28f4;
  float fStack_28f0;
  float fStack_28ec;
  float fStack_28e8;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  RTCIntersectArguments local_27a0;
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar67 [32];
  undefined1 auVar94 [64];
  
  bvh = (BVH *)This->ptr;
  sVar2 = (bvh->root).ptr;
  if (sVar2 != 8) {
    auVar47 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar50 = *(undefined1 (*) [32])(ray + 0x100);
    auVar63 = vpcmpeqd_avx2(auVar47,(undefined1  [32])valid_i->field_0);
    auVar47 = vcmpps_avx(auVar50,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar47 = vandps_avx(auVar47,auVar63);
    uVar26 = vmovmskps_avx(auVar47);
    if (uVar26 != 0) {
      auVar4 = vpackssdw_avx(auVar47._0_16_,auVar47._16_16_);
      local_2960 = *(undefined1 (*) [32])(ray + 0x80);
      local_2940 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_2920 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar78._0_4_ = local_2920._0_4_ * local_2920._0_4_;
      auVar78._4_4_ = local_2920._4_4_ * local_2920._4_4_;
      auVar78._8_4_ = local_2920._8_4_ * local_2920._8_4_;
      auVar78._12_4_ = local_2920._12_4_ * local_2920._12_4_;
      auVar78._16_4_ = local_2920._16_4_ * local_2920._16_4_;
      auVar78._20_4_ = local_2920._20_4_ * local_2920._20_4_;
      auVar78._28_36_ = in_ZMM5._28_36_;
      auVar78._24_4_ = local_2920._24_4_ * local_2920._24_4_;
      auVar65 = vfmadd231ps_fma(auVar78._0_32_,local_2940,local_2940);
      auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),local_2960,local_2960);
      auVar47 = vrsqrtps_avx(ZEXT1632(auVar65));
      pRVar25 = &local_27a0;
      uVar28 = (ulong)(uVar26 & 0xff);
      fVar34 = auVar47._0_4_;
      fVar43 = auVar47._4_4_;
      fVar44 = auVar47._8_4_;
      fVar45 = auVar47._12_4_;
      fVar46 = auVar47._16_4_;
      fVar51 = auVar47._20_4_;
      fVar52 = auVar47._24_4_;
      auVar63._4_4_ = fVar43 * fVar43 * fVar43 * auVar65._4_4_ * -0.5;
      auVar63._0_4_ = fVar34 * fVar34 * fVar34 * auVar65._0_4_ * -0.5;
      auVar63._8_4_ = fVar44 * fVar44 * fVar44 * auVar65._8_4_ * -0.5;
      auVar63._12_4_ = fVar45 * fVar45 * fVar45 * auVar65._12_4_ * -0.5;
      auVar63._16_4_ = fVar46 * fVar46 * fVar46 * -0.0;
      auVar63._20_4_ = fVar51 * fVar51 * fVar51 * -0.0;
      auVar63._24_4_ = fVar52 * fVar52 * fVar52 * -0.0;
      auVar63._28_4_ = 0;
      auVar61._8_4_ = 0x3fc00000;
      auVar61._0_8_ = 0x3fc000003fc00000;
      auVar61._12_4_ = 0x3fc00000;
      auVar61._16_4_ = 0x3fc00000;
      auVar61._20_4_ = 0x3fc00000;
      auVar61._24_4_ = 0x3fc00000;
      auVar61._28_4_ = 0x3fc00000;
      auVar65 = vfmadd213ps_fma(auVar61,auVar47,auVar63);
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar65);
      auVar62._8_4_ = 0x80000000;
      auVar62._0_8_ = 0x8000000080000000;
      auVar62._12_4_ = 0x80000000;
      auVar65._12_4_ = 0;
      auVar65._0_12_ = ZEXT812(0);
      auVar65 = auVar65 << 0x20;
      do {
        lVar30 = 0;
        for (uVar32 = uVar28; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
          lVar30 = lVar30 + 1;
        }
        uVar32 = (ulong)(uint)((int)lVar30 * 4);
        auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar32 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar32 + 0xa0)),0x1c);
        auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + uVar32 + 0xc0)),0x28);
        fVar34 = *(float *)((long)&local_27c0 + uVar32);
        auVar79._0_4_ = auVar75._0_4_ * fVar34;
        auVar79._4_4_ = auVar75._4_4_ * fVar34;
        auVar79._8_4_ = auVar75._8_4_ * fVar34;
        auVar79._12_4_ = auVar75._12_4_ * fVar34;
        auVar86 = vshufpd_avx(auVar79,auVar79,1);
        auVar75 = vmovshdup_avx(auVar79);
        auVar83 = vunpckhps_avx(auVar79,auVar65);
        auVar82._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
        auVar82._8_8_ = auVar86._8_8_ ^ auVar62._8_8_;
        auVar82 = vinsertps_avx(auVar82,auVar79,0x2a);
        auVar83 = vshufps_avx(auVar83,ZEXT416(auVar75._0_4_ ^ 0x80000000),0x41);
        auVar75 = vdpps_avx(auVar82,auVar82,0x7f);
        auVar86 = vdpps_avx(auVar83,auVar83,0x7f);
        auVar75 = vcmpps_avx(auVar75,auVar86,1);
        auVar89._0_4_ = auVar75._0_4_;
        auVar89._4_4_ = auVar89._0_4_;
        auVar89._8_4_ = auVar89._0_4_;
        auVar89._12_4_ = auVar89._0_4_;
        auVar75 = vblendvps_avx(auVar82,auVar83,auVar89);
        auVar86 = vdpps_avx(auVar75,auVar75,0x7f);
        auVar82 = vrsqrtss_avx(auVar86,auVar86);
        fVar43 = auVar82._0_4_;
        fVar43 = fVar43 * 1.5 - auVar86._0_4_ * 0.5 * fVar43 * fVar43 * fVar43;
        auVar83._0_4_ = auVar75._0_4_ * fVar43;
        auVar83._4_4_ = auVar75._4_4_ * fVar43;
        auVar83._8_4_ = auVar75._8_4_ * fVar43;
        auVar83._12_4_ = auVar75._12_4_ * fVar43;
        auVar75 = vshufps_avx(auVar83,auVar83,0xc9);
        auVar86 = vshufps_avx(auVar79,auVar79,0xc9);
        auVar90._0_4_ = auVar83._0_4_ * auVar86._0_4_;
        auVar90._4_4_ = auVar83._4_4_ * auVar86._4_4_;
        auVar90._8_4_ = auVar83._8_4_ * auVar86._8_4_;
        auVar90._12_4_ = auVar83._12_4_ * auVar86._12_4_;
        auVar75 = vfmsub231ps_fma(auVar90,auVar79,auVar75);
        auVar82 = vshufps_avx(auVar75,auVar75,0xc9);
        auVar75 = vdpps_avx(auVar82,auVar82,0x7f);
        lVar30 = lVar30 * 0x30;
        auVar86 = vrsqrtss_avx(auVar75,auVar75);
        fVar43 = auVar86._0_4_;
        fVar43 = fVar43 * 1.5 - auVar75._0_4_ * 0.5 * fVar43 * fVar43 * fVar43;
        uVar28 = uVar28 - 1 & uVar28;
        auVar86._0_4_ = fVar43 * auVar82._0_4_;
        auVar86._4_4_ = fVar43 * auVar82._4_4_;
        auVar86._8_4_ = fVar43 * auVar82._8_4_;
        auVar86._12_4_ = fVar43 * auVar82._12_4_;
        auVar75._0_4_ = fVar34 * auVar79._0_4_;
        auVar75._4_4_ = fVar34 * auVar79._4_4_;
        auVar75._8_4_ = fVar34 * auVar79._8_4_;
        auVar75._12_4_ = fVar34 * auVar79._12_4_;
        auVar82 = vunpcklps_avx(auVar83,auVar75);
        auVar75 = vunpckhps_avx(auVar83,auVar75);
        auVar83 = vunpcklps_avx(auVar86,auVar65);
        auVar86 = vunpckhps_avx(auVar86,auVar65);
        auVar86 = vunpcklps_avx(auVar75,auVar86);
        auVar78 = ZEXT1664(auVar86);
        auVar79 = vunpcklps_avx(auVar82,auVar83);
        auVar75 = vunpckhps_avx(auVar82,auVar83);
        auVar81 = ZEXT1664(auVar75);
        ((RayQueryContext *)((long)pRVar25 + lVar30))->scene = (Scene *)auVar79._0_8_;
        ((RayQueryContext *)((long)pRVar25 + lVar30))->user = (RTCRayQueryContext *)auVar79._8_8_;
        *(undefined1 (*) [16])(auStack_2780 + lVar30 + -0x10) = auVar75;
        *(undefined1 (*) [16])(auStack_2780 + lVar30) = auVar86;
      } while (uVar28 != 0);
      local_29c0._0_8_ = *(undefined8 *)ray;
      local_29c0._8_8_ = *(undefined8 *)(ray + 8);
      local_29c0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_29c0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_29c0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_29c0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_29c0._48_8_ = *(undefined8 *)(ray + 0x30);
      local_29c0._56_8_ = *(undefined8 *)(ray + 0x38);
      local_29c0._64_8_ = *(undefined8 *)(ray + 0x40);
      local_29c0._72_8_ = *(undefined8 *)(ray + 0x48);
      local_29c0._80_8_ = *(undefined8 *)(ray + 0x50);
      local_29c0._88_8_ = *(undefined8 *)(ray + 0x58);
      local_2a00._8_4_ = 0x7fffffff;
      local_2a00._0_8_ = 0x7fffffff7fffffff;
      local_2a00._12_4_ = 0x7fffffff;
      local_2a00._16_4_ = 0x7fffffff;
      local_2a00._20_4_ = 0x7fffffff;
      local_2a00._24_4_ = 0x7fffffff;
      local_2a00._28_4_ = 0x7fffffff;
      auVar92 = ZEXT3264(local_2a00);
      auVar93._8_4_ = 0x219392ef;
      auVar93._0_8_ = 0x219392ef219392ef;
      auVar93._12_4_ = 0x219392ef;
      auVar93._16_4_ = 0x219392ef;
      auVar93._20_4_ = 0x219392ef;
      auVar93._24_4_ = 0x219392ef;
      auVar93._28_4_ = 0x219392ef;
      auVar94 = ZEXT3264(auVar93);
      auVar70._8_4_ = 0x3f800000;
      auVar70._0_8_ = 0x3f8000003f800000;
      auVar70._12_4_ = 0x3f800000;
      auVar70._16_4_ = 0x3f800000;
      auVar70._20_4_ = 0x3f800000;
      auVar70._24_4_ = 0x3f800000;
      auVar70._28_4_ = 0x3f800000;
      auVar47 = vandps_avx(local_2a00,local_2960);
      auVar54 = vdivps_avx(auVar70,local_2960);
      auVar63 = vcmpps_avx(auVar47,auVar93,1);
      auVar58 = vdivps_avx(auVar70,local_2940);
      auVar47 = vandps_avx(local_2a00,local_2940);
      auVar59 = vdivps_avx(auVar70,_local_2920);
      auVar61 = vcmpps_avx(auVar47,auVar93,1);
      auVar47 = vandps_avx(local_2a00,_local_2920);
      auVar72._8_4_ = 0x5d5e0b6b;
      auVar72._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar72._12_4_ = 0x5d5e0b6b;
      auVar72._16_4_ = 0x5d5e0b6b;
      auVar72._20_4_ = 0x5d5e0b6b;
      auVar72._24_4_ = 0x5d5e0b6b;
      auVar72._28_4_ = 0x5d5e0b6b;
      _local_2900 = vblendvps_avx(auVar54,auVar72,auVar63);
      local_28e0 = vblendvps_avx(auVar58,auVar72,auVar61);
      auVar47 = vcmpps_avx(auVar47,auVar93,1);
      local_28c0 = vblendvps_avx(auVar59,auVar72,auVar47);
      auVar47 = vcmpps_avx(_local_2900,ZEXT832(0) << 0x20,1);
      auVar66._8_4_ = 0x10;
      auVar66._0_8_ = 0x1000000010;
      auVar66._12_4_ = 0x10;
      auVar66._16_4_ = 0x10;
      auVar66._20_4_ = 0x10;
      auVar66._24_4_ = 0x10;
      auVar66._28_4_ = 0x10;
      local_28a0 = vandps_avx(auVar47,auVar66);
      auVar58._8_4_ = 0x20;
      auVar58._0_8_ = 0x2000000020;
      auVar58._12_4_ = 0x20;
      auVar58._16_4_ = 0x20;
      auVar58._20_4_ = 0x20;
      auVar58._24_4_ = 0x20;
      auVar58._28_4_ = 0x20;
      auVar67._8_4_ = 0x30;
      auVar67._0_8_ = 0x3000000030;
      auVar67._12_4_ = 0x30;
      auVar67._16_4_ = 0x30;
      auVar67._20_4_ = 0x30;
      auVar67._24_4_ = 0x30;
      auVar67._28_4_ = 0x30;
      auVar69 = ZEXT3264(auVar67);
      auVar47 = vcmpps_avx(local_28e0,ZEXT832(0) << 0x20,5);
      local_2880 = vblendvps_avx(auVar67,auVar58,auVar47);
      auVar54._8_4_ = 0x40;
      auVar54._0_8_ = 0x4000000040;
      auVar54._12_4_ = 0x40;
      auVar54._16_4_ = 0x40;
      auVar54._20_4_ = 0x40;
      auVar54._24_4_ = 0x40;
      auVar54._28_4_ = 0x40;
      auVar59._8_4_ = 0x50;
      auVar59._0_8_ = 0x5000000050;
      auVar59._12_4_ = 0x50;
      auVar59._16_4_ = 0x50;
      auVar59._20_4_ = 0x50;
      auVar59._24_4_ = 0x50;
      auVar59._28_4_ = 0x50;
      auVar63 = ZEXT832(0) << 0x20;
      auVar47 = vcmpps_avx(local_28c0,auVar63,5);
      local_2860 = vblendvps_avx(auVar59,auVar54,auVar47);
      auVar47 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar63);
      auVar50 = vmaxps_avx(auVar50,auVar63);
      local_2800 = vpmovsxwd_avx2(auVar4);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar85 = ZEXT3264(local_1e80);
      local_2840 = vblendvps_avx(local_1e80,auVar47,local_2800);
      auVar47._8_4_ = 0xff800000;
      auVar47._0_8_ = 0xff800000ff800000;
      auVar47._12_4_ = 0xff800000;
      auVar47._16_4_ = 0xff800000;
      auVar47._20_4_ = 0xff800000;
      auVar47._24_4_ = 0xff800000;
      auVar47._28_4_ = 0xff800000;
      local_2820 = vblendvps_avx(auVar47,auVar50,local_2800);
      auVar65 = vpcmpeqd_avx(local_2820._0_16_,local_2820._0_16_);
      local_2a40 = vpmovsxwd_avx2(auVar4 ^ auVar65);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar26 = 5;
      }
      else {
        pRVar25 = context->args;
        uVar26 = (uint)(((ulong)*(Scene **)&pRVar25->flags & 0x10000) == 0) * 3 + 2;
      }
      puVar29 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar33 = (undefined1 (*) [32])local_1e40;
      local_2608 = sVar2;
      local_1e60 = local_2840;
      local_27e0 = mm_lookupmask_ps._16_8_;
      uStack_27d8 = mm_lookupmask_ps._24_8_;
      uStack_27d0 = mm_lookupmask_ps._16_8_;
      uStack_27c8 = mm_lookupmask_ps._24_8_;
      auVar88 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                   CONCAT424(0x3f7ffffa,
                                             CONCAT420(0x3f7ffffa,
                                                       CONCAT416(0x3f7ffffa,
                                                                 CONCAT412(0x3f7ffffa,
                                                                           CONCAT48(0x3f7ffffa,
                                                                                                                                                                        
                                                  0x3f7ffffa3f7ffffa)))))));
      auVar91 = ZEXT3264(CONCAT428(0x3f800003,
                                   CONCAT424(0x3f800003,
                                             CONCAT420(0x3f800003,
                                                       CONCAT416(0x3f800003,
                                                                 CONCAT412(0x3f800003,
                                                                           CONCAT48(0x3f800003,
                                                                                                                                                                        
                                                  0x3f8000033f800003)))))));
LAB_0054cb2a:
      do {
        do {
          root.ptr = puVar29[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0054d13f;
          puVar29 = puVar29 + -1;
          pauVar33 = pauVar33 + -1;
          local_2a20 = *pauVar33;
          auVar57 = ZEXT3264(local_2a20);
          auVar50 = vcmpps_avx(local_2a20,local_2820,1);
        } while ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar50 >> 0x7f,0) == '\0') &&
                   (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar50 >> 0xbf,0) == '\0') &&
                 (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar50[0x1f]);
        uVar24 = vmovmskps_avx(auVar50);
        pRVar25 = (RTCIntersectArguments *)CONCAT44((int)((ulong)pRVar25 >> 0x20),uVar24);
        if (uVar26 < (uint)POPCOUNT(uVar24)) {
LAB_0054cb67:
          do {
            iVar23 = 4;
            lVar30 = 0x1c;
            if ((root.ptr & 8) != 0) {
              if ((RTCIntersectArguments *)root.ptr == (RTCIntersectArguments *)0xfffffffffffffff8)
              goto LAB_0054d13f;
              auVar50 = vcmpps_avx(local_2820,auVar57._0_32_,6);
              if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar50 >> 0x7f,0) != '\0') ||
                    (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar50 >> 0xbf,0) != '\0') ||
                  (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar50[0x1f] < '\0') {
                pRVar25 = (RTCIntersectArguments *)This->leafIntersector;
                local_29e0._8_8_ = uStack_27d8;
                local_29e0._0_8_ = local_27e0;
                local_29e0._16_8_ = uStack_27d0;
                local_29e0._24_8_ = uStack_27c8;
                uVar27 = vmovmskps_avx(local_2a40);
                if ((uVar27 ^ 0xff) != 0) {
                  local_2a20 = local_2a40;
                  uVar28 = (ulong)((uVar27 ^ 0xff) & 0xff);
                  pRVar3 = pRVar25 + (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 2 + 1;
                  do {
                    lVar30 = 0;
                    for (uVar32 = uVar28; (uVar32 & 1) == 0;
                        uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                      lVar30 = lVar30 + 1;
                    }
                    auVar69 = ZEXT1664(auVar69._0_16_);
                    auVar78 = ZEXT1664(auVar78._0_16_);
                    auVar81 = ZEXT1664(auVar81._0_16_);
                    pRVar25 = (RTCIntersectArguments *)context;
                    cVar21 = (*(code *)pRVar3->context)
                                       (&local_27c0,ray,lVar30,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar21 != '\0') {
                      *(undefined4 *)(local_29e0 + lVar30 * 4) = 0xffffffff;
                    }
                    uVar28 = uVar28 - 1 & uVar28;
                  } while (uVar28 != 0);
                  auVar92 = ZEXT3264(local_2a00);
                  auVar94 = ZEXT3264(CONCAT428(0x219392ef,
                                               CONCAT424(0x219392ef,
                                                         CONCAT420(0x219392ef,
                                                                   CONCAT416(0x219392ef,
                                                                             CONCAT412(0x219392ef,
                                                                                       CONCAT48(
                                                  0x219392ef,0x219392ef219392ef)))))));
                  auVar85 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar88 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                               CONCAT424(0x3f7ffffa,
                                                         CONCAT420(0x3f7ffffa,
                                                                   CONCAT416(0x3f7ffffa,
                                                                             CONCAT412(0x3f7ffffa,
                                                                                       CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar91 = ZEXT3264(CONCAT428(0x3f800003,
                                               CONCAT424(0x3f800003,
                                                         CONCAT420(0x3f800003,
                                                                   CONCAT416(0x3f800003,
                                                                             CONCAT412(0x3f800003,
                                                                                       CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                  local_2a40 = local_2a20;
                }
                local_2a40 = vorps_avx(local_29e0,local_2a40);
                auVar50 = _DAT_01fe9960 & ~local_2a40;
                if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar50 >> 0x7f,0) == '\0') &&
                      (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar50 >> 0xbf,0) == '\0') &&
                    (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar50[0x1f]) goto LAB_0054d13f;
                auVar49._8_4_ = 0xff800000;
                auVar49._0_8_ = 0xff800000ff800000;
                auVar49._12_4_ = 0xff800000;
                auVar49._16_4_ = 0xff800000;
                auVar49._20_4_ = 0xff800000;
                auVar49._24_4_ = 0xff800000;
                auVar49._28_4_ = 0xff800000;
                local_2820 = vblendvps_avx(local_2820,auVar49,local_2a40);
              }
              goto LAB_0054cb2a;
            }
            pRVar25 = (RTCIntersectArguments *)(root.ptr & 0xfffffffffffffff0);
            auVar50 = auVar85._0_32_;
            pRVar31 = (RTCIntersectArguments *)0x8;
            do {
              pRVar3 = *(RTCIntersectArguments **)((long)&pRVar25[-7].flags + lVar30 * 8);
              if (pRVar3 == (RTCIntersectArguments *)0x8) {
                auVar57 = ZEXT3264(auVar50);
                break;
              }
              auVar57._28_36_ = auVar78._28_36_;
              if ((root.ptr & 7) == 0) {
                uVar24 = *(undefined4 *)(root.ptr + lVar30 * 4 + -0x50);
                auVar35._4_4_ = uVar24;
                auVar35._0_4_ = uVar24;
                auVar35._8_4_ = uVar24;
                auVar35._12_4_ = uVar24;
                auVar35._16_4_ = uVar24;
                auVar35._20_4_ = uVar24;
                auVar35._24_4_ = uVar24;
                auVar35._28_4_ = uVar24;
                auVar15._8_8_ = local_29c0._8_8_;
                auVar15._0_8_ = local_29c0._0_8_;
                auVar15._16_8_ = local_29c0._16_8_;
                auVar15._24_8_ = local_29c0._24_8_;
                auVar17._8_8_ = local_29c0._40_8_;
                auVar17._0_8_ = local_29c0._32_8_;
                auVar17._16_8_ = local_29c0._48_8_;
                auVar17._24_8_ = local_29c0._56_8_;
                auVar19._8_8_ = local_29c0._72_8_;
                auVar19._0_8_ = local_29c0._64_8_;
                auVar19._16_8_ = local_29c0._80_8_;
                auVar19._24_8_ = local_29c0._88_8_;
                auVar47 = vsubps_avx(auVar35,auVar15);
                auVar69._0_4_ = (float)local_2900._0_4_ * auVar47._0_4_;
                auVar69._4_4_ = (float)local_2900._4_4_ * auVar47._4_4_;
                auVar69._8_4_ = fStack_28f8 * auVar47._8_4_;
                auVar69._12_4_ = fStack_28f4 * auVar47._12_4_;
                auVar69._16_4_ = fStack_28f0 * auVar47._16_4_;
                auVar69._20_4_ = fStack_28ec * auVar47._20_4_;
                auVar69._24_4_ = fStack_28e8 * auVar47._24_4_;
                auVar58 = auVar69._0_32_;
                uVar24 = *(undefined4 *)(root.ptr + lVar30 * 4 + -0x30);
                auVar36._4_4_ = uVar24;
                auVar36._0_4_ = uVar24;
                auVar36._8_4_ = uVar24;
                auVar36._12_4_ = uVar24;
                auVar36._16_4_ = uVar24;
                auVar36._20_4_ = uVar24;
                auVar36._24_4_ = uVar24;
                auVar36._28_4_ = uVar24;
                auVar47 = vsubps_avx(auVar36,auVar17);
                uVar24 = *(undefined4 *)(root.ptr + lVar30 * 4 + -0x10);
                auVar73._4_4_ = uVar24;
                auVar73._0_4_ = uVar24;
                auVar73._8_4_ = uVar24;
                auVar73._12_4_ = uVar24;
                auVar73._16_4_ = uVar24;
                auVar73._20_4_ = uVar24;
                auVar73._24_4_ = uVar24;
                auVar73._28_4_ = uVar24;
                auVar57._0_4_ = local_28e0._0_4_ * auVar47._0_4_;
                auVar57._4_4_ = local_28e0._4_4_ * auVar47._4_4_;
                auVar57._8_4_ = local_28e0._8_4_ * auVar47._8_4_;
                auVar57._12_4_ = local_28e0._12_4_ * auVar47._12_4_;
                auVar57._16_4_ = local_28e0._16_4_ * auVar47._16_4_;
                auVar57._20_4_ = local_28e0._20_4_ * auVar47._20_4_;
                auVar57._24_4_ = local_28e0._24_4_ * auVar47._24_4_;
                auVar76 = auVar57._0_32_;
                auVar47 = vsubps_avx(auVar73,auVar19);
                auVar81._0_4_ = local_28c0._0_4_ * auVar47._0_4_;
                auVar81._4_4_ = local_28c0._4_4_ * auVar47._4_4_;
                auVar81._8_4_ = local_28c0._8_4_ * auVar47._8_4_;
                auVar81._12_4_ = local_28c0._12_4_ * auVar47._12_4_;
                auVar81._16_4_ = local_28c0._16_4_ * auVar47._16_4_;
                auVar81._20_4_ = local_28c0._20_4_ * auVar47._20_4_;
                auVar81._24_4_ = local_28c0._24_4_ * auVar47._24_4_;
                auVar61 = auVar81._0_32_;
                auVar81 = ZEXT3264(auVar61);
                RVar1 = (&((RTCIntersectArguments *)(root.ptr + -0x40))->flags)[lVar30];
                auVar37._4_4_ = RVar1;
                auVar37._0_4_ = RVar1;
                auVar37._8_4_ = RVar1;
                auVar37._12_4_ = RVar1;
                auVar37._16_4_ = RVar1;
                auVar37._20_4_ = RVar1;
                auVar37._24_4_ = RVar1;
                auVar37._28_4_ = RVar1;
                auVar47 = vsubps_avx(auVar37,auVar15);
                auVar5._4_4_ = (float)local_2900._4_4_ * auVar47._4_4_;
                auVar5._0_4_ = (float)local_2900._0_4_ * auVar47._0_4_;
                auVar5._8_4_ = fStack_28f8 * auVar47._8_4_;
                auVar5._12_4_ = fStack_28f4 * auVar47._12_4_;
                auVar5._16_4_ = fStack_28f0 * auVar47._16_4_;
                auVar5._20_4_ = fStack_28ec * auVar47._20_4_;
                auVar5._24_4_ = fStack_28e8 * auVar47._24_4_;
                auVar5._28_4_ = (int)((ulong)local_29c0._24_8_ >> 0x20);
                RVar1 = (&((RTCIntersectArguments *)(root.ptr + -0x20))->flags)[lVar30];
                auVar38._4_4_ = RVar1;
                auVar38._0_4_ = RVar1;
                auVar38._8_4_ = RVar1;
                auVar38._12_4_ = RVar1;
                auVar38._16_4_ = RVar1;
                auVar38._20_4_ = RVar1;
                auVar38._24_4_ = RVar1;
                auVar38._28_4_ = RVar1;
                auVar47 = vsubps_avx(auVar38,auVar17);
                auVar6._4_4_ = local_28e0._4_4_ * auVar47._4_4_;
                auVar6._0_4_ = local_28e0._0_4_ * auVar47._0_4_;
                auVar6._8_4_ = local_28e0._8_4_ * auVar47._8_4_;
                auVar6._12_4_ = local_28e0._12_4_ * auVar47._12_4_;
                auVar6._16_4_ = local_28e0._16_4_ * auVar47._16_4_;
                auVar6._20_4_ = local_28e0._20_4_ * auVar47._20_4_;
                auVar6._24_4_ = local_28e0._24_4_ * auVar47._24_4_;
                auVar6._28_4_ = (int)((ulong)local_29c0._56_8_ >> 0x20);
                RVar1 = (&((RTCIntersectArguments *)root.ptr)->flags)[lVar30];
                auVar39._4_4_ = RVar1;
                auVar39._0_4_ = RVar1;
                auVar39._8_4_ = RVar1;
                auVar39._12_4_ = RVar1;
                auVar39._16_4_ = RVar1;
                auVar39._20_4_ = RVar1;
                auVar39._24_4_ = RVar1;
                auVar39._28_4_ = RVar1;
                auVar47 = vsubps_avx(auVar39,auVar19);
                auVar7._4_4_ = local_28c0._4_4_ * auVar47._4_4_;
                auVar7._0_4_ = local_28c0._0_4_ * auVar47._0_4_;
                auVar7._8_4_ = local_28c0._8_4_ * auVar47._8_4_;
                auVar7._12_4_ = local_28c0._12_4_ * auVar47._12_4_;
                auVar7._16_4_ = local_28c0._16_4_ * auVar47._16_4_;
                auVar7._20_4_ = local_28c0._20_4_ * auVar47._20_4_;
                auVar7._24_4_ = local_28c0._24_4_ * auVar47._24_4_;
                auVar7._28_4_ = (int)((ulong)local_29c0._88_8_ >> 0x20);
                auVar47 = vminps_avx(auVar58,auVar5);
                auVar63 = vminps_avx(auVar76,auVar6);
                auVar47 = vmaxps_avx(auVar47,auVar63);
                auVar63 = vminps_avx(auVar61,auVar7);
                auVar47 = vmaxps_avx(auVar47,auVar63);
                auVar40._4_4_ = auVar88._4_4_ * auVar47._4_4_;
                auVar40._0_4_ = auVar88._0_4_ * auVar47._0_4_;
                auVar40._8_4_ = auVar88._8_4_ * auVar47._8_4_;
                auVar40._12_4_ = auVar88._12_4_ * auVar47._12_4_;
                auVar40._16_4_ = auVar88._16_4_ * auVar47._16_4_;
                auVar40._20_4_ = auVar88._20_4_ * auVar47._20_4_;
                auVar40._24_4_ = auVar88._24_4_ * auVar47._24_4_;
                auVar40._28_4_ = auVar47._28_4_;
                auVar47 = vmaxps_avx(auVar58,auVar5);
                auVar63 = vmaxps_avx(auVar76,auVar6);
                auVar63 = vminps_avx(auVar47,auVar63);
                auVar47 = vmaxps_avx(auVar61,auVar7);
                auVar47 = vminps_avx(auVar63,auVar47);
                auVar8._4_4_ = auVar91._4_4_ * auVar47._4_4_;
                auVar8._0_4_ = auVar91._0_4_ * auVar47._0_4_;
                auVar8._8_4_ = auVar91._8_4_ * auVar47._8_4_;
                auVar8._12_4_ = auVar91._12_4_ * auVar47._12_4_;
                auVar8._16_4_ = auVar91._16_4_ * auVar47._16_4_;
                auVar8._20_4_ = auVar91._20_4_ * auVar47._20_4_;
                auVar8._24_4_ = auVar91._24_4_ * auVar47._24_4_;
                auVar8._28_4_ = auVar47._28_4_;
                auVar47 = vmaxps_avx(auVar40,local_2840);
                auVar63 = vminps_avx(auVar8,local_2820);
              }
              else {
                uVar24 = *(undefined4 *)((long)pRVar25 + lVar30 * 4 + -0x50);
                auVar64._4_4_ = uVar24;
                auVar64._0_4_ = uVar24;
                auVar64._8_4_ = uVar24;
                auVar64._12_4_ = uVar24;
                auVar64._16_4_ = uVar24;
                auVar64._20_4_ = uVar24;
                auVar64._24_4_ = uVar24;
                auVar64._28_4_ = uVar24;
                uVar24 = *(undefined4 *)((long)&pRVar25[-2].flags + lVar30 * 4);
                auVar48._4_4_ = uVar24;
                auVar48._0_4_ = uVar24;
                auVar48._8_4_ = uVar24;
                auVar48._12_4_ = uVar24;
                auVar48._16_4_ = uVar24;
                auVar48._20_4_ = uVar24;
                auVar48._24_4_ = uVar24;
                auVar48._28_4_ = uVar24;
                uVar24 = *(undefined4 *)((long)pRVar25 + lVar30 * 4 + -0x30);
                auVar41._4_4_ = uVar24;
                auVar41._0_4_ = uVar24;
                auVar41._8_4_ = uVar24;
                auVar41._12_4_ = uVar24;
                auVar41._16_4_ = uVar24;
                auVar41._20_4_ = uVar24;
                auVar41._24_4_ = uVar24;
                auVar41._28_4_ = uVar24;
                uVar24 = *(undefined4 *)((long)&pRVar25[-1].flags + lVar30 * 4);
                auVar77._4_4_ = uVar24;
                auVar77._0_4_ = uVar24;
                auVar77._8_4_ = uVar24;
                auVar77._12_4_ = uVar24;
                auVar77._16_4_ = uVar24;
                auVar77._20_4_ = uVar24;
                auVar77._24_4_ = uVar24;
                auVar77._28_4_ = uVar24;
                uVar24 = *(undefined4 *)((long)pRVar25 + lVar30 * 4 + -0x10);
                auVar74._4_4_ = uVar24;
                auVar74._0_4_ = uVar24;
                auVar74._8_4_ = uVar24;
                auVar74._12_4_ = uVar24;
                auVar74._16_4_ = uVar24;
                auVar74._20_4_ = uVar24;
                auVar74._24_4_ = uVar24;
                auVar74._28_4_ = uVar24;
                uVar24 = *(undefined4 *)((long)&pRVar25->flags + lVar30 * 4);
                auVar71._4_4_ = uVar24;
                auVar71._0_4_ = uVar24;
                auVar71._8_4_ = uVar24;
                auVar71._12_4_ = uVar24;
                auVar71._16_4_ = uVar24;
                auVar71._20_4_ = uVar24;
                auVar71._24_4_ = uVar24;
                auVar71._28_4_ = uVar24;
                fVar34 = *(float *)((long)&pRVar25->filter + lVar30 * 4);
                auVar80._4_4_ = fVar34;
                auVar80._0_4_ = fVar34;
                auVar80._8_4_ = fVar34;
                auVar80._12_4_ = fVar34;
                auVar80._16_4_ = fVar34;
                auVar80._20_4_ = fVar34;
                auVar80._24_4_ = fVar34;
                auVar80._28_4_ = fVar34;
                fVar43 = *(float *)((long)&pRVar25[1].flags + lVar30 * 4);
                auVar84._4_4_ = fVar43;
                auVar84._0_4_ = fVar43;
                auVar84._8_4_ = fVar43;
                auVar84._12_4_ = fVar43;
                auVar84._16_4_ = fVar43;
                auVar84._20_4_ = fVar43;
                auVar84._24_4_ = fVar43;
                auVar84._28_4_ = fVar43;
                fVar44 = *(float *)((long)&pRVar25[1].filter + lVar30 * 4);
                auVar87._4_4_ = fVar44;
                auVar87._0_4_ = fVar44;
                auVar87._8_4_ = fVar44;
                auVar87._12_4_ = fVar44;
                auVar87._16_4_ = fVar44;
                auVar87._20_4_ = fVar44;
                auVar87._24_4_ = fVar44;
                auVar87._28_4_ = fVar44;
                uVar24 = *(undefined4 *)((long)&pRVar25[2].flags + lVar30 * 4);
                auVar68._4_4_ = uVar24;
                auVar68._0_4_ = uVar24;
                auVar68._8_4_ = uVar24;
                auVar68._12_4_ = uVar24;
                auVar68._16_4_ = uVar24;
                auVar68._20_4_ = uVar24;
                auVar68._24_4_ = uVar24;
                auVar68._28_4_ = uVar24;
                uVar24 = *(undefined4 *)((long)&pRVar25[2].filter + lVar30 * 4);
                auVar55._4_4_ = uVar24;
                auVar55._0_4_ = uVar24;
                auVar55._8_4_ = uVar24;
                auVar55._12_4_ = uVar24;
                auVar55._16_4_ = uVar24;
                auVar55._20_4_ = uVar24;
                auVar55._24_4_ = uVar24;
                auVar55._28_4_ = uVar24;
                uVar24 = *(undefined4 *)((long)&pRVar25[3].flags + lVar30 * 4);
                auVar60._4_4_ = uVar24;
                auVar60._0_4_ = uVar24;
                auVar60._8_4_ = uVar24;
                auVar60._12_4_ = uVar24;
                auVar60._16_4_ = uVar24;
                auVar60._20_4_ = uVar24;
                auVar60._24_4_ = uVar24;
                auVar60._28_4_ = uVar24;
                auVar20._8_8_ = local_29c0._72_8_;
                auVar20._0_8_ = local_29c0._64_8_;
                auVar20._16_8_ = local_29c0._80_8_;
                auVar20._24_8_ = local_29c0._88_8_;
                auVar4 = vfmadd231ps_fma(auVar68,auVar20,auVar80);
                auVar65 = vfmadd231ps_fma(auVar55,auVar20,auVar84);
                auVar62 = vfmadd231ps_fma(auVar60,auVar20,auVar87);
                auVar9._4_4_ = fVar34 * (float)local_2920._4_4_;
                auVar9._0_4_ = fVar34 * (float)local_2920._0_4_;
                auVar9._8_4_ = fVar34 * fStack_2918;
                auVar9._12_4_ = fVar34 * fStack_2914;
                auVar9._16_4_ = fVar34 * fStack_2910;
                auVar9._20_4_ = fVar34 * fStack_290c;
                auVar9._24_4_ = fVar34 * fStack_2908;
                auVar9._28_4_ = fVar34;
                auVar10._4_4_ = fVar43 * (float)local_2920._4_4_;
                auVar10._0_4_ = fVar43 * (float)local_2920._0_4_;
                auVar10._8_4_ = fVar43 * fStack_2918;
                auVar10._12_4_ = fVar43 * fStack_2914;
                auVar10._16_4_ = fVar43 * fStack_2910;
                auVar10._20_4_ = fVar43 * fStack_290c;
                auVar10._24_4_ = fVar43 * fStack_2908;
                auVar10._28_4_ = fVar43;
                auVar11._4_4_ = fVar44 * (float)local_2920._4_4_;
                auVar11._0_4_ = fVar44 * (float)local_2920._0_4_;
                auVar11._8_4_ = fVar44 * fStack_2918;
                auVar11._12_4_ = fVar44 * fStack_2914;
                auVar11._16_4_ = fVar44 * fStack_2910;
                auVar11._20_4_ = fVar44 * fStack_290c;
                auVar11._24_4_ = fVar44 * fStack_2908;
                auVar11._28_4_ = fVar44;
                auVar75 = vfmadd231ps_fma(auVar9,local_2940,auVar77);
                auVar86 = vfmadd231ps_fma(auVar10,local_2940,auVar74);
                auVar82 = vfmadd231ps_fma(auVar11,auVar71,local_2940);
                auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),local_2960,auVar64);
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),local_2960,auVar48);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar41,local_2960);
                auVar54 = auVar92._0_32_;
                auVar47 = vandps_avx(ZEXT1632(auVar75),auVar54);
                auVar58 = auVar94._0_32_;
                auVar47 = vcmpps_avx(auVar47,auVar58,1);
                auVar63 = vblendvps_avx(ZEXT1632(auVar75),auVar58,auVar47);
                auVar47 = vandps_avx(ZEXT1632(auVar86),auVar54);
                auVar47 = vcmpps_avx(auVar47,auVar58,1);
                auVar61 = vblendvps_avx(ZEXT1632(auVar86),auVar58,auVar47);
                auVar47 = vandps_avx(ZEXT1632(auVar82),auVar54);
                auVar47 = vcmpps_avx(auVar47,auVar58,1);
                auVar47 = vblendvps_avx(ZEXT1632(auVar82),auVar58,auVar47);
                auVar18._8_8_ = local_29c0._40_8_;
                auVar18._0_8_ = local_29c0._32_8_;
                auVar18._16_8_ = local_29c0._48_8_;
                auVar18._24_8_ = local_29c0._56_8_;
                auVar75 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar18,auVar77);
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar18,auVar74);
                auVar54 = vrcpps_avx(auVar63);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar62),auVar18,auVar71);
                auVar91 = ZEXT3264(CONCAT428(0x3f800003,
                                             CONCAT424(0x3f800003,
                                                       CONCAT420(0x3f800003,
                                                                 CONCAT416(0x3f800003,
                                                                           CONCAT412(0x3f800003,
                                                                                     CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                auVar58 = vrcpps_avx(auVar61);
                auVar76._8_4_ = 0x3f800000;
                auVar76._0_8_ = 0x3f8000003f800000;
                auVar76._12_4_ = 0x3f800000;
                auVar76._16_4_ = 0x3f800000;
                auVar76._20_4_ = 0x3f800000;
                auVar76._24_4_ = 0x3f800000;
                auVar76._28_4_ = 0x3f800000;
                auVar4 = vfnmadd213ps_fma(auVar63,auVar54,auVar76);
                auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar54,auVar54);
                auVar81 = ZEXT1664(auVar4);
                auVar65 = vfnmadd213ps_fma(auVar61,auVar58,auVar76);
                auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar58,auVar58);
                auVar63 = vrcpps_avx(auVar47);
                auVar62 = vfnmadd213ps_fma(auVar47,auVar63,auVar76);
                auVar62 = vfmadd132ps_fma(ZEXT1632(auVar62),auVar63,auVar63);
                auVar16._8_8_ = local_29c0._8_8_;
                auVar16._0_8_ = local_29c0._0_8_;
                auVar16._16_8_ = local_29c0._16_8_;
                auVar16._24_8_ = local_29c0._24_8_;
                auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar16,auVar64);
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar16,auVar48);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar16,auVar41);
                fVar46 = auVar75._0_4_ * -auVar4._0_4_;
                fVar51 = auVar75._4_4_ * -auVar4._4_4_;
                auVar12._4_4_ = fVar51;
                auVar12._0_4_ = fVar46;
                fVar52 = auVar75._8_4_ * -auVar4._8_4_;
                auVar12._8_4_ = fVar52;
                fVar53 = auVar75._12_4_ * -auVar4._12_4_;
                auVar12._12_4_ = fVar53;
                auVar12._16_4_ = 0x80000000;
                auVar12._20_4_ = 0x80000000;
                auVar12._24_4_ = 0x80000000;
                auVar12._28_4_ = 0x80000000;
                auVar56._0_4_ = auVar86._0_4_ * -auVar65._0_4_;
                auVar56._4_4_ = auVar86._4_4_ * -auVar65._4_4_;
                auVar56._8_4_ = auVar86._8_4_ * -auVar65._8_4_;
                auVar56._12_4_ = auVar86._12_4_ * -auVar65._12_4_;
                auVar56._16_4_ = 0x80000000;
                auVar56._20_4_ = 0x80000000;
                auVar56._24_4_ = 0x80000000;
                auVar56._28_4_ = 0;
                fVar34 = auVar82._0_4_ * -auVar62._0_4_;
                fVar43 = auVar82._4_4_ * -auVar62._4_4_;
                auVar13._4_4_ = fVar43;
                auVar13._0_4_ = fVar34;
                fVar44 = auVar82._8_4_ * -auVar62._8_4_;
                auVar13._8_4_ = fVar44;
                fVar45 = auVar82._12_4_ * -auVar62._12_4_;
                auVar13._12_4_ = fVar45;
                auVar13._16_4_ = 0x80000000;
                auVar13._20_4_ = 0x80000000;
                auVar13._24_4_ = 0x80000000;
                auVar13._28_4_ = 0x80000000;
                auVar61 = ZEXT1632(CONCAT412(auVar4._12_4_ + fVar53,
                                             CONCAT48(auVar4._8_4_ + fVar52,
                                                      CONCAT44(auVar4._4_4_ + fVar51,
                                                               auVar4._0_4_ + fVar46))));
                auVar54 = ZEXT1632(CONCAT412(auVar65._12_4_ + auVar56._12_4_,
                                             CONCAT48(auVar65._8_4_ + auVar56._8_4_,
                                                      CONCAT44(auVar65._4_4_ + auVar56._4_4_,
                                                               auVar65._0_4_ + auVar56._0_4_))));
                auVar85 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar58 = ZEXT1632(CONCAT412(auVar62._12_4_ + fVar45,
                                             CONCAT48(auVar62._8_4_ + fVar44,
                                                      CONCAT44(auVar62._4_4_ + fVar43,
                                                               auVar62._0_4_ + fVar34))));
                auVar88 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                             CONCAT424(0x3f7ffffa,
                                                       CONCAT420(0x3f7ffffa,
                                                                 CONCAT416(0x3f7ffffa,
                                                                           CONCAT412(0x3f7ffffa,
                                                                                     CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar47 = vpminsd_avx2(auVar12,auVar61);
                auVar63 = vpminsd_avx2(auVar56,auVar54);
                auVar47 = vpmaxsd_avx2(auVar47,auVar63);
                auVar63 = vpminsd_avx2(auVar13,auVar58);
                auVar47 = vpmaxsd_avx2(auVar47,auVar63);
                auVar63 = vpmaxsd_avx2(auVar12,auVar61);
                auVar61 = vpmaxsd_avx2(auVar56,auVar54);
                auVar61 = vpminsd_avx2(auVar63,auVar61);
                auVar63 = vpmaxsd_avx2(auVar13,auVar58);
                auVar61 = vpminsd_avx2(auVar61,auVar63);
                auVar40._4_4_ = auVar47._4_4_ * 0.99999964;
                auVar40._0_4_ = auVar47._0_4_ * 0.99999964;
                auVar40._8_4_ = auVar47._8_4_ * 0.99999964;
                auVar40._12_4_ = auVar47._12_4_ * 0.99999964;
                auVar40._16_4_ = auVar47._16_4_ * 0.99999964;
                auVar40._20_4_ = auVar47._20_4_ * 0.99999964;
                auVar40._24_4_ = auVar47._24_4_ * 0.99999964;
                auVar40._28_4_ = auVar63._28_4_;
                auVar14._4_4_ = auVar61._4_4_ * 1.0000004;
                auVar14._0_4_ = auVar61._0_4_ * 1.0000004;
                auVar14._8_4_ = auVar61._8_4_ * 1.0000004;
                auVar14._12_4_ = auVar61._12_4_ * 1.0000004;
                auVar14._16_4_ = auVar61._16_4_ * 1.0000004;
                auVar14._20_4_ = auVar61._20_4_ * 1.0000004;
                auVar14._24_4_ = auVar61._24_4_ * 1.0000004;
                auVar14._28_4_ = auVar61._28_4_;
                auVar47 = vpmaxsd_avx2(auVar40,local_2840);
                auVar63 = vpminsd_avx2(auVar14,local_2820);
              }
              auVar78 = ZEXT3264(auVar76);
              auVar69 = ZEXT3264(auVar58);
              auVar47 = vcmpps_avx(auVar47,auVar63,2);
              auVar4 = vpackssdw_avx(auVar47._0_16_,auVar47._16_16_);
              auVar47 = vpmovzxwd_avx2(auVar4);
              auVar47 = vpslld_avx2(auVar47,0x1f);
              if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar47 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar47 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar47 >> 0x7f,0) == '\0') &&
                    (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar47 >> 0xbf,0) == '\0') &&
                  (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar47[0x1f]) {
                auVar57 = ZEXT3264(auVar50);
                pRVar3 = pRVar31;
              }
              else {
                auVar47 = vblendvps_avx(auVar85._0_32_,auVar40,auVar47);
                auVar57 = ZEXT3264(auVar47);
                if (pRVar31 != (RTCIntersectArguments *)0x8) {
                  *puVar29 = (ulong)pRVar31;
                  puVar29 = puVar29 + 1;
                  *pauVar33 = auVar50;
                  pauVar33 = pauVar33 + 1;
                }
              }
              pRVar31 = pRVar3;
              lVar30 = lVar30 + 1;
              auVar50 = auVar57._0_32_;
            } while (lVar30 != 0x20);
            pRVar3 = pRVar25;
            if (pRVar31 == (RTCIntersectArguments *)0x8) goto LAB_0054cefb;
            auVar50 = vcmpps_avx(local_2820,auVar57._0_32_,6);
            uVar24 = vmovmskps_avx(auVar50);
            root.ptr = (size_t)pRVar31;
          } while ((byte)uVar26 < (byte)POPCOUNT(uVar24));
          *puVar29 = (ulong)pRVar31;
          puVar29 = puVar29 + 1;
          *pauVar33 = auVar57._0_32_;
          pauVar33 = pauVar33 + 1;
        }
        else {
          for (; pRVar25 != (RTCIntersectArguments *)0x0;
              pRVar25 = (RTCIntersectArguments *)
                        ((ulong)((long)&pRVar25[-1].intersect + 7U) & (ulong)pRVar25)) {
            sVar2 = 0;
            for (pRVar3 = pRVar25; ((ulong)pRVar3 & 1) == 0;
                pRVar3 = (RTCIntersectArguments *)((ulong)pRVar3 >> 1 | 0x8000000000000000)) {
              sVar2 = sVar2 + 1;
            }
            auVar69 = ZEXT1664(auVar69._0_16_);
            auVar78 = ZEXT1664(auVar78._0_16_);
            auVar81 = ZEXT1664(auVar81._0_16_);
            bVar22 = occluded1(This,bvh,root,sVar2,(Precalculations *)&local_27c0,ray,
                               (TravRayK<8,_true> *)&local_29c0.field_0,context);
            if (bVar22) {
              *(undefined4 *)(local_2a40 + sVar2 * 4) = 0xffffffff;
            }
            auVar92 = ZEXT3264(local_2a00);
            auVar94 = ZEXT3264(CONCAT428(0x219392ef,
                                         CONCAT424(0x219392ef,
                                                   CONCAT420(0x219392ef,
                                                             CONCAT416(0x219392ef,
                                                                       CONCAT412(0x219392ef,
                                                                                 CONCAT48(0x219392ef
                                                                                          ,
                                                  0x219392ef219392ef)))))));
            auVar85 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar88 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                         CONCAT424(0x3f7ffffa,
                                                   CONCAT420(0x3f7ffffa,
                                                             CONCAT416(0x3f7ffffa,
                                                                       CONCAT412(0x3f7ffffa,
                                                                                 CONCAT48(0x3f7ffffa
                                                                                          ,
                                                  0x3f7ffffa3f7ffffa)))))));
            auVar91 = ZEXT3264(CONCAT428(0x3f800003,
                                         CONCAT424(0x3f800003,
                                                   CONCAT420(0x3f800003,
                                                             CONCAT416(0x3f800003,
                                                                       CONCAT412(0x3f800003,
                                                                                 CONCAT48(0x3f800003
                                                                                          ,
                                                  0x3f8000033f800003)))))));
            auVar57 = ZEXT3264(local_2a20);
          }
          auVar50 = _DAT_01fe9960 & ~local_2a40;
          iVar23 = 3;
          if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar50 >> 0x7f,0) != '\0') ||
                (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar50 >> 0xbf,0) != '\0') ||
              (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar50[0x1f] < '\0') {
            auVar50._8_4_ = 0xff800000;
            auVar50._0_8_ = 0xff800000ff800000;
            auVar50._12_4_ = 0xff800000;
            auVar50._16_4_ = 0xff800000;
            auVar50._20_4_ = 0xff800000;
            auVar50._24_4_ = 0xff800000;
            auVar50._28_4_ = 0xff800000;
            local_2820 = vblendvps_avx(local_2820,auVar50,local_2a40);
            iVar23 = 2;
          }
          pRVar25 = (RTCIntersectArguments *)0x0;
          pRVar3 = (RTCIntersectArguments *)0x0;
          if (uVar26 < (uint)POPCOUNT(uVar24)) goto LAB_0054cb67;
        }
LAB_0054cefb:
        pRVar25 = pRVar3;
      } while (iVar23 != 3);
LAB_0054d13f:
      auVar50 = vandps_avx(local_2800,local_2a40);
      auVar42._8_4_ = 0xff800000;
      auVar42._0_8_ = 0xff800000ff800000;
      auVar42._12_4_ = 0xff800000;
      auVar42._16_4_ = 0xff800000;
      auVar42._20_4_ = 0xff800000;
      auVar42._24_4_ = 0xff800000;
      auVar42._28_4_ = 0xff800000;
      auVar50 = vmaskmovps_avx(auVar50,auVar42);
      *(undefined1 (*) [32])(ray + 0x100) = auVar50;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }